

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O3

double v3dihedral(point3d *p1,point3d *p2,point3d *p3,point3d *p4)

{
  double dVar1;
  double dVar3;
  undefined1 auVar2 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar1 = p2->x;
  dVar4 = p2->y;
  dVar6 = p2->z;
  dVar9 = p3->x;
  dVar10 = p3->y;
  dVar8 = p3->z;
  dVar15 = p1->x - dVar1;
  dVar16 = dVar1 - dVar9;
  dVar13 = p1->y - dVar4;
  dVar14 = dVar4 - dVar10;
  dVar17 = p1->z - dVar6;
  dVar18 = dVar6 - dVar8;
  dVar3 = p4->x - dVar9;
  dVar7 = p4->y - dVar10;
  dVar5 = p4->z - dVar8;
  dVar11 = dVar13 * (dVar8 - dVar6) - (dVar10 - dVar4) * dVar17;
  dVar12 = dVar14 * dVar5 - dVar7 * dVar18;
  dVar6 = dVar17 * (dVar9 - dVar1) - (dVar8 - dVar6) * dVar15;
  dVar8 = dVar18 * dVar3 - dVar5 * dVar16;
  dVar9 = dVar15 * (dVar10 - dVar4) - (dVar9 - dVar1) * dVar13;
  dVar10 = dVar16 * dVar7 - dVar3 * dVar14;
  auVar2._0_8_ = dVar9 * dVar9 + dVar11 * dVar11 + dVar6 * dVar6;
  auVar2._8_8_ = dVar10 * dVar10 + dVar12 * dVar12 + dVar8 * dVar8;
  auVar2 = sqrtpd(auVar2,auVar2);
  dVar4 = auVar2._8_8_ * auVar2._0_8_;
  dVar1 = 0.0;
  if (0.0001 <= dVar4) {
    dVar1 = acos((dVar9 * dVar10 + dVar11 * dVar12 + dVar6 * dVar8) / dVar4);
  }
  dVar3 = dVar6 * dVar18 - dVar14 * dVar9;
  dVar9 = dVar9 * dVar16 - dVar18 * dVar11;
  dVar6 = dVar14 * dVar11 - dVar16 * dVar6;
  dVar4 = SQRT(dVar6 * dVar6 + dVar3 * dVar3 + dVar9 * dVar9) * auVar2._8_8_;
  if ((0.0001 <= dVar4) &&
     (dVar4 = acos((dVar6 * dVar10 + dVar3 * dVar12 + dVar9 * dVar8) / dVar4),
     90.0 < dVar4 * 57.29578)) {
    dVar1 = -dVar1;
  }
  return dVar1;
}

Assistant:

double  v3dihedral(point3d* p1, point3d* p2, point3d* p3, point3d* p4) {
	vector3d a, b, c, d, e, f;
	double dmag, emag, fmag, theta, phi;

	v3cross(v3sub(p1, p2, &a), v3sub(p3, p2, &b), &d);
	v3cross(v3sub(p2, p3, &b), v3sub(p4, p3, &c), &e);
	dmag = v3length(&d);
	emag = v3length(&e);

	if (dmag*emag < 0.0001) { theta = 0.0; }
	else { theta = acos(v3dot(&d, &e)/(dmag*emag)); }

	v3cross(&d, &b, &f); /* this part sets the correct handedness */
	fmag = v3length(&f);
	if (fmag*emag < 0.0001) { phi = 0.0; }
	else { phi = acos(v3dot(&f, &e)/(fmag*emag)); }

	if (phi*RAD2DEG > 90.0) { theta = - theta; };

	return(theta);
}